

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O3

bool QFileSystemEngine::mkpath
               (QFileSystemEntry *entry,optional<QFlags<QFileDevice::Permission>_> permissions)

{
  char *pcVar1;
  uint uVar2;
  void *pvVar3;
  QSystemError QVar4;
  int *piVar5;
  uint uVar6;
  bool bVar7;
  mode_t mode;
  char *b;
  long in_FS_OFFSET;
  NativePath local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFileSystemEntry::nativeFilePath(&local_38,entry);
  pcVar1 = local_38.d.ptr;
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    pvVar3 = memchr(local_38.d.ptr,0,local_38.d.size);
    if ((long)pvVar3 - (long)pcVar1 == -1 || pvVar3 == (void *)0x0) {
      mode = 0x1ff;
      if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                  _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> >> 0x20
          & 1) != 0) {
        uVar2 = (uint)(((ulong)permissions.
                               super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                               _M_payload.
                               super__Optional_payload_base<QFlags<QFileDevice::Permission>_> &
                       0x4400) != 0) * 0x100;
        uVar6 = uVar2 + 0x80;
        if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                    _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> &
            0x2200) == 0) {
          uVar6 = uVar2;
        }
        uVar2 = uVar6 + 0x40;
        if (((ulong)permissions.super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                    _M_payload.super__Optional_payload_base<QFlags<QFileDevice::Permission>_> &
            0x1100) == 0) {
          uVar2 = uVar6;
        }
        mode = (uint)((ulong)permissions.
                             super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                             _M_payload.
                             super__Optional_payload_base<QFlags<QFileDevice::Permission>_> >> 1) &
               0x38 | (uint)permissions.
                            super__Optional_base<QFlags<QFileDevice::Permission>,_true,_true>.
                            _M_payload.
                            super__Optional_payload_base<QFlags<QFileDevice::Permission>_>.
                            _M_payload & 7 | uVar2;
      }
      removeTrailingSlashes(&local_38);
      QVar4 = createDirectoryWithParents(&local_38,mode);
      bVar7 = (ulong)QVar4 >> 0x20 == 0;
      goto LAB_0016fd15;
    }
  }
  piVar5 = __errno_location();
  *piVar5 = 0x16;
  bVar7 = false;
LAB_0016fd15:
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::mkpath(const QFileSystemEntry &entry,
                              std::optional<QFile::Permissions> permissions)
{
    QByteArray path = entry.nativeFilePath();
    Q_CHECK_FILE_NAME(path, false);

    mode_t mode = permissions ? QtPrivate::toMode_t(*permissions) : 0777;
    return createDirectoryWithParents(removeTrailingSlashes(path), mode).ok();
}